

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall SGParser::Generator::Lex::CheckForErrorAndReport(Lex *this,char *message,...)

{
  uint uVar1;
  String local_130;
  allocator<char> local_f9;
  String local_f8;
  undefined1 local_d8 [8];
  ParseMessage msg;
  String messageStr;
  va_list argList;
  char *message_local;
  Lex *this_local;
  
  uVar1 = ParseMessageBuffer::GetMessageFlags(&this->Messages);
  if ((uVar1 & 1) != 0) {
    messageStr.field_2._12_4_ = 0x30;
    messageStr.field_2._8_4_ = 0x10;
    StringWithVAFormat<char>
              ((String *)((long)&msg.FileName.field_2 + 8),message,
               (__va_list_tag *)((long)&messageStr.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    std::__cxx11::string::string((string *)&local_130);
    ParseMessage::ParseMessage
              ((ParseMessage *)local_d8,ErrorMessage,&local_f8,
               (String *)((long)&msg.FileName.field_2 + 8),0,0xffffffffffffffff,0xffffffffffffffff,
               &local_130,0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)local_d8);
    ParseMessage::~ParseMessage((ParseMessage *)local_d8);
    std::__cxx11::string::~string((string *)(msg.FileName.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Lex::CheckForErrorAndReport(const char* message...) {
    if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
        va_list argList;
        va_start(argList, message);
        const auto messageStr = StringWithVAFormat(message, argList);
        va_end(argList);

        const ParseMessage msg{ParseMessage::ErrorMessage, "", messageStr};
        Messages.AddMessage(msg);
    }
}